

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TraverseSchema.cpp
# Opt level: O0

void __thiscall
xercesc_4_0::TraverseSchema::renameRedefinedComponents
          (TraverseSchema *this,DOMElement *redefineElem,SchemaInfo *redefiningSchemaInfo,
          SchemaInfo *redefinedSchemaInfo)

{
  RefHash2KeysTableOf<char16_t,_xercesc_4_0::StringHasher> *this_00;
  XMLStringPool *pXVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  XMLCh *str1;
  XMLCh *chars;
  XMLCh *pXVar5;
  undefined4 extraout_var;
  XMLCh *tmpChildName;
  XMLCh *typeName;
  XMLCh *childName;
  DOMElement *child;
  SchemaInfo *redefinedSchemaInfo_local;
  SchemaInfo *redefiningSchemaInfo_local;
  DOMElement *redefineElem_local;
  TraverseSchema *this_local;
  
  for (childName = (XMLCh *)XUtil::getFirstChildElement(&redefineElem->super_DOMNode);
      childName != (XMLCh *)0x0;
      childName = (XMLCh *)XUtil::getNextSiblingElement((DOMNode *)childName)) {
    str1 = (XMLCh *)(**(code **)(*(long *)childName + 0xc0))();
    bVar2 = XMLString::equals(str1,(XMLCh *)SchemaSymbols::fgELT_ANNOTATION);
    if (!bVar2) {
      chars = getElementAttValue(this,(DOMElement *)childName,(XMLCh *)SchemaSymbols::fgATT_NAME,
                                 NCName);
      XMLBuffer::set(&this->fBuffer,this->fTargetNSURIString);
      XMLBuffer::append(&this->fBuffer,L',');
      XMLBuffer::append(&this->fBuffer,chars);
      this_00 = this->fRedefineComponents;
      pXVar1 = this->fStringPool;
      pXVar5 = XMLBuffer::getRawBuffer(&this->fBuffer);
      iVar3 = (*(pXVar1->super_XSerializable)._vptr_XSerializable[5])(pXVar1,pXVar5);
      bVar2 = RefHash2KeysTableOf<char16_t,_xercesc_4_0::StringHasher>::containsKey
                        (this_00,str1,iVar3);
      if (!bVar2) {
        pXVar1 = this->fStringPool;
        uVar4 = (*(this->fStringPool->super_XSerializable)._vptr_XSerializable[5])
                          (this->fStringPool,str1);
        iVar3 = (*(pXVar1->super_XSerializable)._vptr_XSerializable[10])(pXVar1,(ulong)uVar4);
        bVar2 = validateRedefineNameChange
                          (this,(DOMElement *)childName,(XMLCh *)CONCAT44(extraout_var,iVar3),chars,
                           1,redefiningSchemaInfo);
        if (bVar2) {
          fixRedefinedSchema(this,(DOMElement *)childName,redefinedSchemaInfo,
                             (XMLCh *)CONCAT44(extraout_var,iVar3),chars,1);
        }
        else {
          SchemaInfo::addFailedRedefine(redefiningSchemaInfo,(DOMElement *)childName);
        }
      }
    }
  }
  return;
}

Assistant:

void TraverseSchema::renameRedefinedComponents(const DOMElement* const redefineElem,
                                               SchemaInfo* const redefiningSchemaInfo,
                                               SchemaInfo* const redefinedSchemaInfo) {

    DOMElement* child = XUtil::getFirstChildElement(redefineElem);

    for (; child != 0; child = XUtil::getNextSiblingElement(child)) {

        const XMLCh* childName = child->getLocalName();

        if (XMLString::equals(childName, SchemaSymbols::fgELT_ANNOTATION)) {
            continue;
        }

        // if component already redefined skip
        const XMLCh* typeName = getElementAttValue(child, SchemaSymbols::fgATT_NAME, DatatypeValidator::NCName);

        fBuffer.set(fTargetNSURIString);
        fBuffer.append(chComma);
        fBuffer.append(typeName);

        if (fRedefineComponents->containsKey(childName, fStringPool->addOrFind(fBuffer.getRawBuffer()))) {
            continue;
        }

        // Rename
        const XMLCh* tmpChildName = fStringPool->getValueForId(fStringPool->addOrFind(childName));

        if (validateRedefineNameChange(child, tmpChildName, typeName, 1, redefiningSchemaInfo)) {
            fixRedefinedSchema(child, redefinedSchemaInfo, tmpChildName, typeName, 1);
        }
        else {
            redefiningSchemaInfo->addFailedRedefine(child);
        }
    }
}